

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_bin.c
# Opt level: O3

void duckdb_je_cache_bin_info_compute_alloc
               (cache_bin_info_t *infos,szind_t ninfos,size_t *size,size_t *alignment)

{
  size_t sVar1;
  ulong uVar2;
  
  *size = 0x10;
  if (ninfos != 0) {
    sVar1 = 0x10;
    uVar2 = 0;
    do {
      sVar1 = sVar1 + (ulong)infos[uVar2].ncached_max * 8;
      uVar2 = uVar2 + 1;
    } while (ninfos != uVar2);
    *size = sVar1;
  }
  sVar1 = 0x10;
  if (duckdb_je_opt_metadata_thp == metadata_thp_disabled) {
    sVar1 = 0x1000;
  }
  *alignment = sVar1;
  return;
}

Assistant:

void
cache_bin_info_compute_alloc(const cache_bin_info_t *infos, szind_t ninfos,
    size_t *size, size_t *alignment) {
	/* For the total bin stack region (per tcache), reserve 2 more slots so
	 * that
	 * 1) the empty position can be safely read on the fast path before
	 *    checking "is_empty"; and
	 * 2) the cur_ptr can go beyond the empty position by 1 step safely on
	 * the fast path (i.e. no overflow).
	 */
	*size = sizeof(void *) * 2;
	for (szind_t i = 0; i < ninfos; i++) {
		*size += infos[i].ncached_max * sizeof(void *);
	}

	/*
	 * When not using THP, align to at least PAGE, to minimize the # of TLBs
	 * needed by the smaller sizes; also helps if the larger sizes don't get
	 * used at all.
	 */
	*alignment = cache_bin_stack_use_thp() ? QUANTUM : PAGE;
}